

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_impl.hpp
# Opt level: O1

void __thiscall Catch::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_WildcardPattern = (_func_int **)&PTR__WildcardPattern_0018d5c8;
  pcVar2 = (this->m_pattern)._M_dataplus._M_p;
  paVar1 = &(this->m_pattern).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

WildcardPattern::~WildcardPattern() {}